

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitTableGet(FunctionValidator *this,TableGet *curr)

{
  Type left;
  bool bVar1;
  Table *pTVar2;
  
  shouldBeTrue<wasm::TableGet*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 8) & 1),curr,
             "table.get requires reference types [--enable-reference-types]");
  pTVar2 = Module::getTableOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->table).super_IString.str);
  bVar1 = shouldBeTrue<wasm::TableGet*>
                    (this,pTVar2 != (Table *)0x0,curr,"table.get table must exist");
  if (bVar1) {
    left.id = (curr->super_SpecificExpression<(wasm::Expression::Id)45>).super_Expression.type.id;
    if (left.id != 1) {
      shouldBeEqual<wasm::TableGet*,wasm::Type>
                (this,left,(Type)(pTVar2->type).id,curr,"table.get must have same type as table.");
    }
    shouldBeEqualOrFirstIsUnreachable<wasm::TableGet*,wasm::Type>
              (this,(Type)(curr->index->type).id,(Type)(pTVar2->addressType).id,curr,
               "table.get index must match the table index type.");
    return;
  }
  return;
}

Assistant:

void FunctionValidator::visitTableGet(TableGet* curr) {
  shouldBeTrue(getModule()->features.hasReferenceTypes(),
               curr,
               "table.get requires reference types [--enable-reference-types]");
  auto* table = getModule()->getTableOrNull(curr->table);
  if (shouldBeTrue(!!table, curr, "table.get table must exist")) {
    if (curr->type != Type::unreachable) {
      shouldBeEqual(curr->type,
                    table->type,
                    curr,
                    "table.get must have same type as table.");
    }
    shouldBeEqualOrFirstIsUnreachable(
      curr->index->type,
      table->addressType,
      curr,
      "table.get index must match the table index type.");
  }
}